

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall polyscope::render::backend_openGL3_glfw::GLEngine::initializeImGui(GLEngine *this)

{
  ImGuiIO *compressed_ttf_data;
  ImFontConfig *in_RDI;
  ImFont *font;
  ImFontConfig config;
  ImGuiIO *io;
  char *glsl_version;
  Engine *in_stack_000001f0;
  undefined1 in_stack_ffffffffffffff3f;
  GLFWwindow *in_stack_ffffffffffffff40;
  ImFontAtlas *in_stack_ffffffffffffff70;
  ImWchar *in_stack_ffffffffffffffd0;
  ImFontConfig *in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  char *this_00;
  
  (**(code **)((long)in_RDI->FontData + 0x10))();
  ImGui::CreateContext(in_stack_ffffffffffffff70);
  ImGui_ImplGlfw_InitForOpenGL(in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
  this_00 = "#version 150";
  ImGui_ImplOpenGL3_Init((char *)in_RDI);
  compressed_ttf_data = ImGui::GetIO();
  ImFontConfig::ImFontConfig(in_RDI);
  getCousineRegularCompressedData();
  getCousineRegularCompressedSize();
  ImFontAtlas::AddFontFromMemoryCompressedTTF
            ((ImFontAtlas *)this_00,compressed_ttf_data,in_stack_ffffffffffffffe4,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Engine::setImGuiStyle(in_stack_000001f0);
  *(ImFontAtlas **)&in_RDI[4].GlyphOffset.y = compressed_ttf_data->Fonts;
  return;
}

Assistant:

void GLEngine::initializeImGui() {

  bindDisplay();

  ImGui::CreateContext(); // must call once at start

  // Set up ImGUI glfw bindings
  ImGui_ImplGlfw_InitForOpenGL(mainWindow, true);
  const char* glsl_version = "#version 150";
  ImGui_ImplOpenGL3_Init(glsl_version);

  ImGuiIO& io = ImGui::GetIO();
  ImFontConfig config;
  config.OversampleH = 5;
  config.OversampleV = 5;
  ImFont* font = io.Fonts->AddFontFromMemoryCompressedTTF(getCousineRegularCompressedData(),
                                                          getCousineRegularCompressedSize(), 15.0f, &config);
  // io.OptResizeWindowsFromEdges = true;
  // ImGui::StyleColorsLight();
  setImGuiStyle();

  globalFontAtlas = io.Fonts;
}